

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QRect __thiscall QToolBarAreaLayout::itemRect(QToolBarAreaLayout *this,QList<int> *path)

{
  int iVar1;
  LayoutDirection direction;
  long in_FS_OFFSET;
  QRect QVar2;
  QArrayDataPointer<int> QStack_58;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  QList<int>::mid((QList<int> *)&QStack_58,path,1,-1);
  QVar2 = QToolBarAreaLayoutInfo::itemRect(this->docks + iVar1,(QList<int> *)&QStack_58);
  local_40 = QVar2;
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_58);
  if (this->docks[iVar1].o == Horizontal) {
    direction = QWidget::layoutDirection(&this->mainWindow->super_QWidget);
    QVar2 = QStyle::visualRect(direction,&this->docks[iVar1].rect,&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QToolBarAreaLayout::itemRect(const QList<int> &path) const
{
    const int i = path.first();

    QRect r = docks[i].itemRect(path.mid(1));
    if (docks[i].o == Qt::Horizontal)
        r = QStyle::visualRect(mainWindow->layoutDirection(),
                                docks[i].rect, r);
    return r;
}